

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O0

void __thiscall Assimp::AC3DImporter::AC3DImporter(AC3DImporter *this)

{
  AC3DImporter *this_local;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00f3fd68;
  this->buffer = (char *)0x0;
  this->configSplitBFCull = false;
  this->configEvalSubdivision = false;
  this->mNumMeshes = 0;
  this->mLights = (vector<aiLight_*,_std::allocator<aiLight_*>_> *)0x0;
  this->lights = 0;
  this->groups = 0;
  this->polys = 0;
  this->worlds = 0;
  return;
}

Assistant:

AC3DImporter::AC3DImporter()
    : buffer(),
    configSplitBFCull(),
    configEvalSubdivision(),
    mNumMeshes(),
    mLights(),
    lights(),
    groups(),
    polys(),
    worlds()
{
    // nothing to be done here
}